

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

void apriltag_detector_remove_family(apriltag_detector_t *td,apriltag_family_t *fam)

{
  apriltag_family_t *local_18;
  apriltag_family_t *fam_local;
  apriltag_detector_t *td_local;
  
  local_18 = fam;
  fam_local = (apriltag_family_t *)td;
  quick_decode_uninit(fam);
  zarray_remove_value((zarray_t *)fam_local[1].codes,&local_18,0);
  return;
}

Assistant:

void apriltag_detector_remove_family(apriltag_detector_t *td, apriltag_family_t *fam)
{
    quick_decode_uninit(fam);
    zarray_remove_value(td->tag_families, &fam, 0);
}